

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonarray.cpp
# Opt level: O0

QJsonValue * __thiscall QJsonArray::at(QJsonArray *this,qsizetype i)

{
  bool bVar1;
  QCborContainerPrivate *pQVar2;
  qsizetype qVar3;
  QCborValue *in_RDX;
  undefined8 in_RSI;
  QCborContainerPrivate *in_RDI;
  long in_FS_OFFSET;
  QCborValue *this_00;
  QCborContainerPrivate *this_01;
  Type type;
  QJsonValue *in_stack_ffffffffffffffb8;
  QCborValue local_20;
  long local_8;
  
  type = (Type)((ulong)in_RSI >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  bVar1 = QExplicitlySharedDataPointer<QCborContainerPrivate>::operator!
                    ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x486d11);
  if ((!bVar1) && (-1 < (long)in_RDX)) {
    pQVar2 = QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x486d31);
    qVar3 = QList<QtCbor::Element>::size(&pQVar2->elements);
    if ((long)in_RDX < qVar3) {
      QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
                ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x486d65);
      this_00 = &local_20;
      QCborContainerPrivate::valueAt(this_01,(qsizetype)in_RDI);
      QJsonPrivate::Value::fromTrustedCbor(in_RDX);
      ::QCborValue::~QCborValue(this_00);
      goto LAB_00486db7;
    }
  }
  QJsonValue::QJsonValue(in_stack_ffffffffffffffb8,type);
LAB_00486db7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QJsonValue *)this_01;
  }
  __stack_chk_fail();
}

Assistant:

QJsonValue QJsonArray::at(qsizetype i) const
{
    if (!a || i < 0 || i >= a->elements.size())
        return QJsonValue(QJsonValue::Undefined);

    return QJsonPrivate::Value::fromTrustedCbor(a->valueAt(i));
}